

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O3

string * StateName_abi_cxx11_(string *__return_storage_ptr__,ThresholdState state)

{
  long lVar1;
  string *extraout_RAX;
  char *pcVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(state) {
  case DEFINED:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0078638d:
      __stack_chk_fail();
    }
    pcVar3 = "DEFINED";
    pcVar2 = "";
    break;
  case STARTED:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0078638d;
    pcVar3 = "STARTED";
    pcVar2 = "";
    break;
  case LOCKED_IN:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0078638d;
    pcVar3 = "LOCKED_IN";
    pcVar2 = "";
    break;
  case ACTIVE:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0078638d;
    pcVar3 = "ACTIVE";
    pcVar2 = "";
    break;
  case FAILED:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0078638d;
    pcVar3 = "FAILED";
    pcVar2 = "";
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0078638d;
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return extraout_RAX;
}

Assistant:

static std::string StateName(ThresholdState state)
{
    switch (state) {
    case ThresholdState::DEFINED:   return "DEFINED";
    case ThresholdState::STARTED:   return "STARTED";
    case ThresholdState::LOCKED_IN: return "LOCKED_IN";
    case ThresholdState::ACTIVE:    return "ACTIVE";
    case ThresholdState::FAILED:    return "FAILED";
    } // no default case, so the compiler can warn about missing cases
    return "";
}